

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor *
ggml_set_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,size_t nb1,size_t nb2,size_t nb3,
             size_t offset,_Bool inplace)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  char *file;
  
  if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] < b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3]) {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
    pcVar2 = "ggml_nelements(a) >= ggml_nelements(b)";
    line = 0xb3e;
  }
  else {
    if (inplace) {
      pgVar1 = ggml_view_tensor(ctx,a);
    }
    else {
      pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
    }
    if (offset < 0x40000000) {
      if (pgVar1 != (ggml_tensor *)0x0) {
        pgVar1->op_params[0] = (int32_t)nb1;
        pgVar1->op_params[1] = (int32_t)nb2;
        pgVar1->op_params[2] = (int32_t)nb3;
        pgVar1->op_params[3] = (int32_t)offset;
        pgVar1->op_params[4] = (uint)inplace;
        pgVar1->op = GGML_OP_SET;
        pgVar1->src[0] = a;
        pgVar1->src[1] = b;
        return pgVar1;
      }
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-impl.h";
      pcVar2 = "tensor != NULL";
      line = 0x70;
    }
    else {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
      pcVar2 = "offset < (size_t)(1 << 30)";
      line = 0xb43;
    }
  }
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

static struct ggml_tensor * ggml_set_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        size_t                nb1,
        size_t                nb2,
        size_t                nb3,
        size_t                offset,
        bool                  inplace) {
    GGML_ASSERT(ggml_nelements(a) >= ggml_nelements(b));

    // make a view of the destination
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    GGML_ASSERT(offset < (size_t)(1 << 30));
    int32_t params[] = { nb1, nb2, nb3, offset, inplace ? 1 : 0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_SET;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}